

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_getenviron(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long *plVar1;
  JSAtom prop;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *__s;
  JSValue JVar6;
  JSValue val;
  int64_t local_48;
  JSValueUnion local_40;
  
  JVar6 = JS_NewObject(ctx);
  plVar1 = _environ;
  local_48 = 6;
  if ((uint)JVar6.tag == 6) {
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    __s = (char *)*_environ;
    local_40 = JVar6.u;
    local_48 = JVar6.tag;
    if (__s != (char *)0x0) {
      uVar5 = 1;
      do {
        pcVar3 = strchr(__s,0x3d);
        if (pcVar3 != (char *)0x0) {
          prop = JS_NewAtomLen(ctx,__s,(long)pcVar3 - (long)__s);
          if (prop != 0) {
            val = JS_NewString(ctx,pcVar3 + 1);
            iVar2 = JS_DefinePropertyValue(ctx,JVar6,prop,val,7);
            JS_FreeAtom(ctx,prop);
            if (-1 < iVar2) goto LAB_00111aa7;
          }
          if ((0xfffffff4 < (uint)JVar6.tag) &&
             (iVar2 = *local_40.ptr, *(int *)local_40.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValue(ctx,JVar6);
          }
          uVar5 = 0;
          uVar4 = 0;
          local_48 = 6;
          goto LAB_00111b11;
        }
LAB_00111aa7:
        __s = (char *)plVar1[uVar5];
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (__s != (char *)0x0);
    }
    uVar4 = (ulong)local_40.ptr & 0xffffffff00000000;
    uVar5 = (ulong)local_40.ptr & 0xffffffff;
  }
LAB_00111b11:
  JVar6.u.ptr = (void *)(uVar5 | uVar4);
  JVar6.tag = local_48;
  return JVar6;
}

Assistant:

static JSValue js_std_getenviron(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    char **envp;
    const char *name, *p, *value;
    JSValue obj;
    uint32_t idx;
    size_t name_len;
    JSAtom atom;
    int ret;

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    envp = environ;
    for(idx = 0; envp[idx] != NULL; idx++) {
        name = envp[idx];
        p = strchr(name, '=');
        name_len = p - name;
        if (!p)
            continue;
        value = p + 1;
        atom = JS_NewAtomLen(ctx, name, name_len);
        if (atom == JS_ATOM_NULL)
            goto fail;
        ret = JS_DefinePropertyValue(ctx, obj, atom, JS_NewString(ctx, value),
                                     JS_PROP_C_W_E);
        JS_FreeAtom(ctx, atom);
        if (ret < 0)
            goto fail;
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}